

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangles.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  bov_text_t *text;
  bov_text_t *pbVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int local_468;
  int i_1;
  uint mode;
  double wtime;
  unsigned_long frameCount;
  undefined8 local_448;
  undefined8 local_440;
  bov_order_t *local_438;
  bov_order_t *order;
  undefined4 local_428;
  undefined4 local_424;
  GLfloat local_420 [4];
  bov_points_t *local_410;
  bov_points_t *pointset;
  GLfloat coord [6] [2];
  GLfloat local_3cc [4];
  int local_3bc;
  int i;
  bov_text_t *label_with_order [8];
  bov_text_t *label [8];
  _func_void_bov_window_t_ptr_bov_points_t_ptr_bov_order_t_ptr_GLint_GLsizei
  *functions_with_order [8];
  GLubyte local_2ce [42];
  GLubyte local_2a4 [37];
  GLubyte local_27f [34];
  GLubyte local_25d [35];
  GLubyte local_23a [37];
  GLubyte local_215 [32];
  undefined8 local_1f5;
  GLubyte local_1ed [21];
  undefined8 *local_1d8;
  GLubyte *label_msg_with_order [8];
  _func_void_bov_window_t_ptr_bov_points_t_ptr_GLint_GLsizei *functions [8];
  GLubyte local_14e [180];
  undefined8 local_9a;
  GLubyte local_92 [10];
  undefined8 *local_88;
  GLubyte *label_msg [8];
  bov_text_t *common_label;
  GLubyte common_msg [23];
  bov_window_t *window;
  char **argv_local;
  int argc_local;
  
  register0x00000000 = bov_window_new(0x438,0x280,*argv);
  common_label = (bov_text_t *)0x6e697265646e6572;
  builtin_memcpy(common_msg,"g points using",0xf);
  text = bov_text_new((GLubyte *)&common_label,0x88e4);
  label_msg[7]._0_4_ = 0xbf800000;
  label_msg[7]._4_4_ = 0x3f666666;
  bov_text_set_pos(text,(GLfloat *)(label_msg + 7));
  local_9a._0_1_ = 'b';
  local_9a._1_1_ = 'o';
  local_9a._2_1_ = 'v';
  local_9a._3_1_ = '_';
  local_9a._4_1_ = 'p';
  local_9a._5_1_ = 'o';
  local_9a._6_1_ = 'i';
  local_9a._7_1_ = 'n';
  builtin_memcpy(local_92,"ts_draw()",10);
  local_88 = &local_9a;
  builtin_memcpy(local_14e + 0x9f,"bov_triangles_draw()",0x15);
  label_msg[0] = local_14e + 0x9f;
  builtin_memcpy(local_14e + 0x85,"bov_triangle_strip_draw()",0x1a);
  label_msg[1] = local_14e + 0x85;
  builtin_memcpy(local_14e + 0x6d,"bov_triangle_fan_draw()",0x18);
  label_msg[2] = local_14e + 0x6d;
  builtin_memcpy(local_14e + 0x56,"bov_fast_points_draw()",0x17);
  label_msg[3] = local_14e + 0x56;
  builtin_memcpy(local_14e + 0x3c,"bov_fast_triangles_draw()",0x1a);
  label_msg[4] = local_14e + 0x3c;
  builtin_memcpy(local_14e + 0x1d,"bov_fast_triangle_strip_draw()",0x1f);
  label_msg[5] = local_14e + 0x1d;
  builtin_memcpy(local_14e,"bov_fast_triangle_fan_draw()",0x1d);
  label_msg[6] = local_14e;
  memcpy(label_msg_with_order + 7,&PTR_bov_points_draw_001ba500,0x40);
  local_1f5._0_1_ = 'b';
  local_1f5._1_1_ = 'o';
  local_1f5._2_1_ = 'v';
  local_1f5._3_1_ = '_';
  local_1f5._4_1_ = 'p';
  local_1f5._5_1_ = 'o';
  local_1f5._6_1_ = 'i';
  local_1f5._7_1_ = 'n';
  builtin_memcpy(local_1ed,"ts_draw_with_order()",0x15);
  local_1d8 = &local_1f5;
  builtin_memcpy(local_215,"bov_triangles_draw_with_order()",0x20);
  label_msg_with_order[0] = local_215;
  memcpy(local_23a,"bov_triangle_strip_draw_with_order()",0x25);
  label_msg_with_order[1] = local_23a;
  memcpy(local_25d,"bov_triangle_fan_draw_with_order()",0x23);
  label_msg_with_order[2] = local_25d;
  memcpy(local_27f,"bov_fast_points_draw_with_order()",0x22);
  label_msg_with_order[3] = local_27f;
  memcpy(local_2a4,"bov_fast_triangles_draw_with_order()",0x25);
  label_msg_with_order[4] = local_2a4;
  memcpy(local_2ce,"bov_fast_triangle_strip_draw_with_order()",0x2a);
  label_msg_with_order[5] = local_2ce;
  memcpy((void *)((long)functions_with_order + 0x3a),"bov_fast_triangle_fan_draw_with_order()",0x28)
  ;
  label_msg_with_order[6] = (GLubyte *)((long)functions_with_order + 0x3a);
  memcpy(label + 7,&PTR_bov_points_draw_with_order_001ba540,0x40);
  for (local_3bc = 0; local_3bc < 8; local_3bc = local_3bc + 1) {
    pbVar3 = bov_text_new(label_msg[(long)local_3bc + -1],0x88e4);
    label_with_order[(long)local_3bc + 7] = pbVar3;
    pbVar3 = bov_text_new(label_msg_with_order[(long)local_3bc + -1],0x88e4);
    *(bov_text_t **)(&stack0xfffffffffffffc48 + (long)local_3bc * 8) = pbVar3;
    local_3cc[2] = -0.425;
    local_3cc[3] = 0.9;
    bov_text_set_pos(label_with_order[(long)local_3bc + 7],local_3cc + 2);
    local_3cc[0] = -0.425;
    local_3cc[1] = 0.9;
    bov_text_set_pos(*(bov_text_t **)(&stack0xfffffffffffffc48 + (long)local_3bc * 8),local_3cc);
  }
  memcpy(&pointset,&DAT_0012a280,0x30);
  local_410 = bov_points_new((GLfloat (*) [2])&pointset,6,0x88e4);
  local_420[0] = 0.05;
  local_420[1] = 0.1;
  local_420[2] = 0.2;
  local_420[3] = 0.6;
  bov_points_set_color(local_410,local_420);
  bov_points_set_outline_width(local_410,0.025);
  bov_points_set_width(local_410,0.0);
  order._0_4_ = 0x3e99999a;
  order._4_4_ = 0;
  local_428 = 0;
  local_424 = 0x3f000000;
  bov_points_set_outline_color(local_410,(GLfloat *)&order);
  frameCount = 0x100000000;
  local_448 = 0x300000002;
  local_440 = 0x500000004;
  local_438 = bov_order_new((GLuint *)&frameCount,6,0x88e4);
  wtime = 0.0;
  while( true ) {
    iVar1 = bov_window_should_close(stack0xffffffffffffffe0);
    if (iVar1 != 0) break;
    dVar4 = bov_window_get_time(stack0xffffffffffffffe0);
    bov_text_draw(stack0xffffffffffffffe0,text);
    uVar2 = (uint)((ulong)(long)dVar4 >> 1) & 0xf;
    if (uVar2 < 8) {
      bov_text_draw(stack0xffffffffffffffe0,label_with_order[(ulong)uVar2 + 7]);
      (*(code *)label_msg_with_order[(ulong)uVar2 + 7])(stack0xffffffffffffffe0,local_410,0);
    }
    else {
      bov_text_draw(stack0xffffffffffffffe0,
                    *(bov_text_t **)(&stack0xfffffffffffffc48 + (ulong)(uVar2 - 8) * 8));
      (*(code *)label[(ulong)(uVar2 - 8) + 7])
                (stack0xffffffffffffffe0,local_410,local_438,0,0x7fffffff);
    }
    bov_window_update(stack0xffffffffffffffe0);
    wtime = (double)((long)wtime + 1);
  }
  dVar4 = bov_window_get_time(stack0xffffffffffffffe0);
  auVar6._8_4_ = (int)((ulong)wtime >> 0x20);
  auVar6._0_8_ = wtime;
  auVar6._12_4_ = 0x45300000;
  dVar5 = bov_window_get_time(stack0xffffffffffffffe0);
  printf("Ended correctly - %.2f second, %lu frames, %.2f fps\n",dVar4,
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,SUB84(wtime,0)) - 4503599627370496.0)) / dVar5,wtime);
  for (local_468 = 0; local_468 < 8; local_468 = local_468 + 1) {
    bov_text_delete(label_with_order[(long)local_468 + 7]);
    bov_text_delete(*(bov_text_t **)(&stack0xfffffffffffffc48 + (long)local_468 * 8));
  }
  bov_text_delete(text);
  bov_points_delete(local_410);
  bov_window_delete(stack0xffffffffffffffe0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bov_window_t* window = bov_window_new(1080,640, argv[0]);

	const GLubyte common_msg[] = "rendering points using";
	bov_text_t* common_label = bov_text_new(common_msg,
	                                        GL_STATIC_DRAW);
	bov_text_set_pos(common_label, (GLfloat[2]) {-1.0, 0.9});

	// make an array of message
	const GLubyte* label_msg[8] = {
		(GLubyte[]){"bov_points_draw()"},
		(GLubyte[]){"bov_triangles_draw()"},
		(GLubyte[]){"bov_triangle_strip_draw()"},
		(GLubyte[]){"bov_triangle_fan_draw()"},
		(GLubyte[]){"bov_fast_points_draw()"},
		(GLubyte[]){"bov_fast_triangles_draw()"},
		(GLubyte[]){"bov_fast_triangle_strip_draw()"},
		(GLubyte[]){"bov_fast_triangle_fan_draw()"},
	};

	void (*functions[8])(bov_window_t* window,
	                     const bov_points_t* pts,
	                     GLint start,
	                     GLsizei count) = {
		bov_points_draw,
		bov_triangles_draw,
		bov_triangle_strip_draw,
		bov_triangle_fan_draw,
		bov_fast_points_draw,
		bov_fast_triangles_draw,
		bov_fast_triangle_strip_draw,
		bov_fast_triangle_fan_draw,
	};

	const GLubyte* label_msg_with_order[8] = {
		(GLubyte[]){"bov_points_draw_with_order()"},
		(GLubyte[]){"bov_triangles_draw_with_order()"},
		(GLubyte[]){"bov_triangle_strip_draw_with_order()"},
		(GLubyte[]){"bov_triangle_fan_draw_with_order()"},
		(GLubyte[]){"bov_fast_points_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangles_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangle_strip_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangle_fan_draw_with_order()"},
	};

	void (*functions_with_order[8])(bov_window_t* window,
                                    const bov_points_t* pts,
                                    const bov_order_t* order,
                                    GLint start,
                                    GLsizei count) = {
		bov_points_draw_with_order,
		bov_triangles_draw_with_order,
		bov_triangle_strip_draw_with_order,
		bov_triangle_fan_draw_with_order,
		bov_fast_points_draw_with_order,
		bov_fast_triangles_draw_with_order,
		bov_fast_triangle_strip_draw_with_order,
		bov_fast_triangle_fan_draw_with_order,
	};

	// with an array of corresponding labels
	bov_text_t* label[8];
	bov_text_t* label_with_order[8];
	for(int i=0; i<8; i++) {
		label[i] = bov_text_new(label_msg[i], GL_STATIC_DRAW);
		label_with_order[i] = bov_text_new(label_msg_with_order[i], GL_STATIC_DRAW);
		bov_text_set_pos(label[i], (GLfloat[2]) {-1.0 + 23 * 0.025, 0.9});
		bov_text_set_pos(label_with_order[i], (GLfloat[2]) {-1.0 + 23 * 0.025, 0.9});
	}

	/*
	GLfloat coord[][2] = {
		{0, 0},
		{1, 0},
		{0.6*0.8660254582502496, 0.6*0.49999990566243624},
		{0.5000001886751096, 0.8660252948527859},
		{0.6*3.2679489653813835e-07, 0.6*0.9999999999999466},
		{-0.49999962264970943, 0.8660256216476209},
		{-0.6*0.8660251314552299, 0.6*0.5000004716877294},
		{-0.9999999999997864, 6.535897930762419e-07},
		{-0.6*0.8660257850448994, -0.6*0.4999993396369297},
		{-0.5000007547002964, -0.8660249680575809},
		{-0.6*9.803846891701863e-07, -0.6*0.9999999999995194},
		{0.49999905662409616, -0.8660259484420856},
		{0.6*0.86602480465984, -0.6*0.5000010377128091},
		{1, 0},
	};*/
	GLfloat coord[][2] = {
		{0, 0},
		{1, 0},
		{0.5, 0.5},
		{2, 2},
		{4, 4},
		{6, 2}
	};

	//bov_points_t* pointset = bov_points_new(coord, 14, GL_STATIC_DRAW);
	bov_points_t* pointset = bov_points_new(coord, 6, GL_STATIC_DRAW);
	bov_points_set_color(pointset, (float[4]) {0.05, 0.1, 0.2, 0.6});
	bov_points_set_outline_width(pointset, 0.025);
	bov_points_set_width(pointset, 0.0);
	bov_points_set_outline_color(pointset, (GLfloat[4]) {0.3, 0.0, 0.0, 0.5});

	/*
	bov_order_t* order = bov_order_new((GLuint[14]) {0, 2, 4, 6, 8, 14, 12, 1, 3, 5, 7, 9, 11, 13},
	                                    10,
	                                    GL_STATIC_DRAW);*/
	bov_order_t* order = bov_order_new((GLuint[6]) {0, 1, 2, 3, 4, 5}, 6, GL_STATIC_DRAW);

	unsigned long frameCount = 0;
	while(!bov_window_should_close(window)) {
		double wtime = bov_window_get_time(window);

		bov_text_draw(window, common_label);
		unsigned mode = (unsigned) wtime / 2 % 16;

		if(mode<8) {
			bov_text_draw(window, label[mode]);
			functions[mode](window, pointset, 0, BOV_TILL_END);
		}
		else {
			bov_text_draw(window, label_with_order[mode-8]);
			functions_with_order[mode-8](window, pointset, order, 0, BOV_TILL_END);
		}

		bov_window_update(window);

		frameCount++;
	}

	printf("Ended correctly - %.2f second, %lu frames, %.2f fps\n",
	       bov_window_get_time(window),
	       frameCount,
	       frameCount / bov_window_get_time(window));

	for(int i=0; i<8; i++) {
		bov_text_delete(label[i]);
		bov_text_delete(label_with_order[i]);
	}
	bov_text_delete(common_label);

	bov_points_delete(pointset);

	bov_window_delete(window);

	return EXIT_SUCCESS;
}